

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.h
# Opt level: O1

int __thiscall
Js::ConcatStringMulti::GetRandomAccessItemsFromConcatString
          (ConcatStringMulti *this,JavascriptString ***items)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  undefined4 *puVar5;
  
  uVar2 = (ulong)this->slotCount;
  do {
    uVar4 = uVar2;
    if (uVar4 == 0) goto LAB_00b3deeb;
    uVar2 = uVar4 - 1;
  } while ((&this->__alignmentPTR)[uVar4] != 0);
  if (uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ConcatString.h"
                                ,0x105,"(IsFilled())","IsFilled()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
LAB_00b3deeb:
  *items = (JavascriptString **)(this + 1);
  return this->slotCount;
}

Assistant:

virtual int GetRandomAccessItemsFromConcatString(Js::JavascriptString * const *& items) const
        {
            Assert(IsFilled());
            items = AddressOf(m_slots[0]);
            return slotCount;
        }